

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O0

CopyCounterGuy __thiscall
TestClass::SyncRetFunc5
          (TestClass *this,uint64_t *p1,uint32_t p2,uint16_t *p3,CopyCounterGuy *ccg1,uint8_t *p4)

{
  ulong uVar1;
  SyncRetEventAgent5<TestClass,_TestClass::CopyCounterGuy,_unsigned_long_&,_unsigned_int,_unsigned_short_&,_TestClass::CopyCounterGuy_&,_unsigned_char_&>
  *this_00;
  size_t __n;
  undefined4 in_register_00000014;
  uint param2;
  char *in_stack_00000008;
  undefined1 local_68 [24];
  undefined8 local_50;
  SyncRetEventAgent5<TestClass,_TestClass::CopyCounterGuy,_unsigned_long_&,_unsigned_int,_unsigned_short_&,_TestClass::CopyCounterGuy_&,_unsigned_char_&>
  *local_48;
  SyncRetEventAgent5<TestClass,_TestClass::CopyCounterGuy,_unsigned_long_&,_unsigned_int,_unsigned_short_&,_TestClass::CopyCounterGuy_&,_unsigned_char_&>
  *agent;
  CopyCounterGuy *ccg1_local;
  uint16_t *p3_local;
  long *plStack_28;
  uint32_t p2_local;
  uint64_t *p1_local;
  TestClass *this_local;
  CopyCounterGuy *newGuy;
  
  plStack_28 = (long *)CONCAT44(in_register_00000014,p2);
  p3_local._4_4_ = (uint)p3;
  agent = (SyncRetEventAgent5<TestClass,_TestClass::CopyCounterGuy,_unsigned_long_&,_unsigned_int,_unsigned_short_&,_TestClass::CopyCounterGuy_&,_unsigned_char_&>
           *)p4;
  ccg1_local = ccg1;
  p1_local = p1;
  this_local = this;
  uVar1 = EventDispatcher::isThreadCurrent();
  if ((uVar1 & 1) == 0) {
    CopyCounterGuy::CopyCounterGuy((CopyCounterGuy *)this);
    this_00 = (SyncRetEventAgent5<TestClass,_TestClass::CopyCounterGuy,_unsigned_long_&,_unsigned_int,_unsigned_short_&,_TestClass::CopyCounterGuy_&,_unsigned_char_&>
               *)operator_new(0x58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventAgentTest.cpp"
                              ,0x155);
    local_68._16_8_ = SyncRetFunc5;
    local_50 = 0;
    __n = 0;
    param2 = (uint)plStack_28;
    SyncRetEventAgent5<TestClass,_TestClass::CopyCounterGuy,_unsigned_long_&,_unsigned_int,_unsigned_short_&,_TestClass::CopyCounterGuy_&,_unsigned_char_&>
    ::SyncRetEventAgent5
              (this_00,(TestClass *)p1,0x10d6a0,(unsigned_long *)0x0,param2,
               (unsigned_short *)(ulong)p3_local._4_4_,ccg1_local,(uchar *)agent);
    local_48 = this_00;
    SyncRetEventAgent<TestClass::CopyCounterGuy>::send
              ((SyncRetEventAgent<TestClass::CopyCounterGuy> *)local_68,(int)this_00,p1 + 1,__n,
               param2);
    CopyCounterGuy::operator=((CopyCounterGuy *)this,(CopyCounterGuy *)local_68);
  }
  else {
    *plStack_28 = *plStack_28 + 0x400;
    p3_local._4_4_ = p3_local._4_4_ + 0x200;
    *(short *)&ccg1_local->mCount = (short)ccg1_local->mCount + 0x100;
    *in_stack_00000008 = *in_stack_00000008 + '\x10';
    CopyCounterGuy::CopyCounterGuy((CopyCounterGuy *)this);
  }
  return (CopyCounterGuy)(int)this;
}

Assistant:

CopyCounterGuy SyncRetFunc5(uint64_t& p1, uint32_t p2, uint16_t& p3, CopyCounterGuy& ccg1, uint8_t& p4)
	{
		if (not mEventThread.isThreadCurrent())
		{
			CopyCounterGuy result;
			SyncRetEventAgent5<TestClass, CopyCounterGuy, uint64_t &, uint32_t, uint16_t &, CopyCounterGuy &, uint8_t &>* agent =
				jh_new SyncRetEventAgent5<TestClass, CopyCounterGuy, uint64_t &, uint32_t, uint16_t &, CopyCounterGuy &, uint8_t&>(this, &TestClass::SyncRetFunc5,
				p1, p2, p3, ccg1, p4);
			result = agent->send(&mEventThread);
			LOG_INFO("RetVal(%d) p1(%llu) p2(%u) p3(%u) ccg1(%d) p4(%u)", result.getCount(), p1, p2, p3, ccg1.getCount(), p4);
			return result;
		}
		
		LOG_INFO("Received p1(%llu) p2(%u) p3(%u) ccg1(%d) p4(%u)", p1, p2, p3, ccg1.getCount(), p4);
		p1+=1024;
		p2+=512;
		p3+=256;
		p4+=16;
		CopyCounterGuy newGuy;
		return newGuy;
	}